

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import.c
# Opt level: O1

openssh_new_key * load_openssh_new_key(BinarySource *filesrc,char **errmsg_p)

{
  byte bVar1;
  BinarySourceError BVar2;
  size_t sVar3;
  BinarySource *pBVar4;
  _Bool _Var5;
  int iVar6;
  int iVar7;
  uint uVar8;
  openssh_new_key *b;
  strbuf *psVar9;
  byte *__s1;
  unsigned_long uVar10;
  char *pcVar11;
  size_t sVar12;
  openssh_new_kdf oVar13;
  long lVar14;
  char *pcVar15;
  openssh_new_cipher oVar16;
  byte *pbVar17;
  ptrlen pVar18;
  char base64_bit [4];
  BinarySource src [1];
  BinarySource opts [1];
  byte local_8c [4];
  BinarySource local_88;
  BinarySource *local_60;
  BinarySource local_58;
  
  __s1 = (byte *)0x0;
  b = (openssh_new_key *)safemalloc(1,0x40,0);
  psVar9 = strbuf_new_nm();
  b->keyblob = psVar9;
  pVar18 = BinarySource_get_chomped_line(filesrc->binarysource_);
  if (filesrc->binarysource_->err == BSE_NO_ERROR) {
    __s1 = (byte *)mkstr(pVar18);
  }
  pcVar15 = "unexpected end of file";
  if (__s1 == (byte *)0x0) goto LAB_00114a5e;
  iVar6 = strcmp((char *)__s1,"-----BEGIN OPENSSH PRIVATE KEY-----");
  if (iVar6 == 0) {
    iVar6 = 0;
    local_60 = filesrc;
    while( true ) {
      pBVar4 = local_60;
      sVar12 = strlen((char *)__s1);
      smemclr(__s1,sVar12);
      safefree(__s1);
      pVar18 = BinarySource_get_chomped_line(pBVar4->binarysource_);
      if (pBVar4->binarysource_->err == BSE_NO_ERROR) {
        __s1 = (byte *)mkstr(pVar18);
      }
      else {
        __s1 = (byte *)0x0;
      }
      if (__s1 == (byte *)0x0) {
        __s1 = (byte *)0x0;
        pcVar15 = "unexpected end of file";
        goto LAB_00114a60;
      }
      iVar7 = strcmp((char *)__s1,"-----END OPENSSH PRIVATE KEY-----");
      pbVar17 = __s1;
      if (iVar7 == 0) break;
      while (((bVar1 = *pbVar17, (byte)(bVar1 - 0x30) < 10 || ((byte)((bVar1 & 0xdf) + 0xbf) < 0x1a)
              ) || ((bVar1 < 0x3e && ((0x2000880000000000U >> ((ulong)(uint)bVar1 & 0x3f) & 1) != 0)
                    )))) {
        lVar14 = (long)iVar6;
        iVar6 = iVar6 + 1;
        local_8c[lVar14] = bVar1;
        if (iVar6 == 4) {
          uVar8 = base64_decode_atom((char *)local_8c,(uchar *)&local_88);
          if ((int)uVar8 < 1) {
            pcVar15 = "invalid base64 encoding";
            goto LAB_00114a60;
          }
          BinarySink_put_data(b->keyblob->binarysink_,&local_88,(ulong)uVar8);
          smemclr(&local_88,3);
          iVar6 = 0;
        }
        pbVar17 = pbVar17 + 1;
      }
    }
    safefree(__s1);
    sVar3 = b->keyblob->len;
    if (sVar3 == 0) {
      pcVar15 = "key body not present";
    }
    else {
      local_88.data = b->keyblob->u;
      local_88.pos = 0;
      local_88.err = BSE_NO_ERROR;
      local_88.len = sVar3;
      local_88.binarysource_ = &local_88;
      pcVar15 = BinarySource_get_asciz(&local_88);
      iVar6 = strcmp(pcVar15,"openssh-key-v1");
      __s1 = (byte *)0x0;
      oVar16 = ON_E_NONE;
      if (iVar6 != 0) {
        pcVar15 = "new-style OpenSSH magic number missing\n";
        goto LAB_00114a60;
      }
      pVar18 = BinarySource_get_string(local_88.binarysource_);
      _Var5 = ptrlen_eq_string(pVar18,"none");
      if (_Var5) {
LAB_001148f0:
        b->cipher = oVar16;
        pVar18 = BinarySource_get_string(local_88.binarysource_);
        _Var5 = ptrlen_eq_string(pVar18,"none");
        oVar13 = ON_K_NONE;
        if (!_Var5) {
          _Var5 = ptrlen_eq_string(pVar18,"bcrypt");
          oVar13 = ON_K_BCRYPT;
          if (!_Var5) {
            BVar2 = (local_88.binarysource_)->err;
            pcVar11 = "unrecognised kdf name\n";
            pcVar15 = "no kdf name found";
            goto LAB_00114ae7;
          }
        }
        b->kdf = oVar13;
        pVar18 = BinarySource_get_string(local_88.binarysource_);
        if (b->kdf == ON_K_BCRYPT) {
          local_58.binarysource_ = &local_58;
          local_58.pos = 0;
          local_58.err = BSE_NO_ERROR;
          local_58.data = pVar18.ptr;
          local_58.len = pVar18.len;
          pVar18 = BinarySource_get_string(local_58.binarysource_);
          (b->kdfopts).bcrypt.salt = pVar18;
          uVar10 = BinarySource_get_uint32(local_58.binarysource_);
          (b->kdfopts).bcrypt.rounds = (int)uVar10;
          pcVar15 = "failed to parse bcrypt options string";
          if ((local_58.binarysource_)->err == BSE_NO_ERROR) goto LAB_001149c7;
        }
        else if ((b->kdf == ON_K_NONE) && (pVar18.len != 0)) {
          pcVar15 = "expected empty options string for \'none\' kdf";
        }
        else {
LAB_001149c7:
          uVar10 = BinarySource_get_uint32(local_88.binarysource_);
          b->nkeys = (int)uVar10;
          if ((int)uVar10 == 1) {
            b->key_wanted = 0;
            if (b->nkeys != 0) {
              uVar8 = 0;
              do {
                BinarySource_get_string(local_88.binarysource_);
                uVar8 = uVar8 + 1;
              } while (uVar8 < (uint)b->nkeys);
            }
            pVar18 = BinarySource_get_string(local_88.binarysource_);
            b->private = pVar18;
            if ((local_88.binarysource_)->err == BSE_NO_ERROR) {
              smemclr(local_8c,4);
              if (errmsg_p == (char **)0x0) {
                return b;
              }
              pcVar15 = (char *)0x0;
              goto LAB_00114aba;
            }
            pcVar15 = "no private key container string found\n";
          }
          else {
            pcVar15 = "no key count found";
            if ((local_88.binarysource_)->err == BSE_NO_ERROR) {
              pcVar15 = "multiple keys in new-style OpenSSH key file not supported\n";
            }
          }
        }
LAB_00114a5e:
        __s1 = (byte *)0x0;
        goto LAB_00114a60;
      }
      _Var5 = ptrlen_eq_string(pVar18,"aes256-cbc");
      oVar16 = ON_E_AES256CBC;
      if (_Var5) goto LAB_001148f0;
      _Var5 = ptrlen_eq_string(pVar18,"aes256-ctr");
      oVar16 = ON_E_AES256CTR;
      if (_Var5) goto LAB_001148f0;
      BVar2 = (local_88.binarysource_)->err;
      pcVar11 = "unrecognised cipher name\n";
      pcVar15 = "no cipher name found";
LAB_00114ae7:
      if (BVar2 == BSE_NO_ERROR) {
        pcVar15 = pcVar11;
      }
    }
    __s1 = (byte *)0x0;
  }
  else {
    pcVar15 = "file does not begin with OpenSSH new-style key header";
  }
LAB_00114a60:
  if (__s1 != (byte *)0x0) {
    sVar12 = strlen((char *)__s1);
    smemclr(__s1,sVar12);
    safefree(__s1);
  }
  smemclr(local_8c,4);
  if (b != (openssh_new_key *)0x0) {
    strbuf_free(b->keyblob);
    smemclr(b,0x40);
    safefree(b);
  }
  b = (openssh_new_key *)0x0;
  if (errmsg_p == (char **)0x0) {
    return (openssh_new_key *)0x0;
  }
LAB_00114aba:
  *errmsg_p = pcVar15;
  return b;
}

Assistant:

static struct openssh_new_key *load_openssh_new_key(BinarySource *filesrc,
                                                    const char **errmsg_p)
{
    struct openssh_new_key *ret;
    char *line = NULL;
    const char *errmsg;
    char *p;
    char base64_bit[4];
    int base64_chars = 0;
    BinarySource src[1];
    ptrlen str;
    unsigned key_index;

    ret = snew(struct openssh_new_key);
    ret->keyblob = strbuf_new_nm();

    if (!(line = bsgetline(filesrc))) {
        errmsg = "unexpected end of file";
        goto error;
    }
    if (0 != strcmp(line, "-----BEGIN OPENSSH PRIVATE KEY-----")) {
        errmsg = "file does not begin with OpenSSH new-style key header";
        goto error;
    }
    smemclr(line, strlen(line));
    sfree(line);
    line = NULL;

    while (1) {
        if (!(line = bsgetline(filesrc))) {
            errmsg = "unexpected end of file";
            goto error;
        }
        if (0 == strcmp(line, "-----END OPENSSH PRIVATE KEY-----")) {
            sfree(line);
            line = NULL;
            break;                     /* done */
        }

        p = line;
        while (isbase64(*p)) {
            base64_bit[base64_chars++] = *p;
            if (base64_chars == 4) {
                unsigned char out[3];
                int len;

                base64_chars = 0;

                len = base64_decode_atom(base64_bit, out);

                if (len <= 0) {
                    errmsg = "invalid base64 encoding";
                    goto error;
                }

                put_data(ret->keyblob, out, len);

                smemclr(out, sizeof(out));
            }

            p++;
        }
        smemclr(line, strlen(line));
        sfree(line);
        line = NULL;
    }

    if (ret->keyblob->len == 0) {
        errmsg = "key body not present";
        goto error;
    }

    BinarySource_BARE_INIT_PL(src, ptrlen_from_strbuf(ret->keyblob));

    if (strcmp(get_asciz(src), "openssh-key-v1") != 0) {
        errmsg = "new-style OpenSSH magic number missing\n";
        goto error;
    }

    /* Cipher name */
    str = get_string(src);
    if (ptrlen_eq_string(str, "none")) {
        ret->cipher = ON_E_NONE;
    } else if (ptrlen_eq_string(str, "aes256-cbc")) {
        ret->cipher = ON_E_AES256CBC;
    } else if (ptrlen_eq_string(str, "aes256-ctr")) {
        ret->cipher = ON_E_AES256CTR;
    } else {
        errmsg = get_err(src) ? "no cipher name found" :
            "unrecognised cipher name\n";
        goto error;
    }

    /* Key derivation function name */
    str = get_string(src);
    if (ptrlen_eq_string(str, "none")) {
        ret->kdf = ON_K_NONE;
    } else if (ptrlen_eq_string(str, "bcrypt")) {
        ret->kdf = ON_K_BCRYPT;
    } else {
        errmsg = get_err(src) ? "no kdf name found" :
            "unrecognised kdf name\n";
        goto error;
    }

    /* KDF extra options */
    str = get_string(src);
    switch (ret->kdf) {
      case ON_K_NONE:
        if (str.len != 0) {
            errmsg = "expected empty options string for 'none' kdf";
            goto error;
        }
        break;
      case ON_K_BCRYPT: {
        BinarySource opts[1];

        BinarySource_BARE_INIT_PL(opts, str);
        ret->kdfopts.bcrypt.salt = get_string(opts);
        ret->kdfopts.bcrypt.rounds = get_uint32(opts);

        if (get_err(opts)) {
          errmsg = "failed to parse bcrypt options string";
          goto error;
        }
        break;
      }
    }

    /*
     * At this point we expect a uint32 saying how many keys are
     * stored in this file. OpenSSH new-style key files can
     * contain more than one. Currently we don't have any user
     * interface to specify which one we're trying to extract, so
     * we just bomb out with an error if more than one is found in
     * the file. However, I've put in all the mechanism here to
     * extract the nth one for a given n, in case we later connect
     * up some UI to that mechanism. Just arrange that the
     * 'key_wanted' field is set to a value in the range [0,
     * nkeys) by some mechanism.
     */
    ret->nkeys = toint(get_uint32(src));
    if (ret->nkeys != 1) {
        errmsg = get_err(src) ? "no key count found" :
            "multiple keys in new-style OpenSSH key file not supported\n";
        goto error;
    }
    ret->key_wanted = 0;

    /* Read and ignore a string per public key. */
    for (key_index = 0; key_index < ret->nkeys; key_index++)
        str = get_string(src);

    /*
     * Now we expect a string containing the encrypted part of the
     * key file.
     */
    ret->private = get_string(src);
    if (get_err(src)) {
        errmsg = "no private key container string found\n";
        goto error;
    }

    /*
     * And now we're done, until asked to actually decrypt.
     */

    smemclr(base64_bit, sizeof(base64_bit));
    if (errmsg_p) *errmsg_p = NULL;
    return ret;

    error:
    if (line) {
        smemclr(line, strlen(line));
        sfree(line);
        line = NULL;
    }
    smemclr(base64_bit, sizeof(base64_bit));
    if (ret) {
        strbuf_free(ret->keyblob);
        smemclr(ret, sizeof(*ret));
        sfree(ret);
    }
    if (errmsg_p) *errmsg_p = errmsg;
    return NULL;
}